

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_bgr2rgb(Mat *m,uchar *rgb,int stride)

{
  Mat *this;
  float *pfVar1;
  int *piVar2;
  int in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  int remain;
  int y;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  Mat *this_00;
  int _c;
  Mat *in_stack_fffffffffffffea8;
  int local_14c [3];
  int local_140 [3];
  int local_134 [3];
  int local_128;
  int local_124;
  Mat local_120;
  float *local_d8;
  Mat local_d0;
  float *local_88;
  Mat local_70;
  Mat *local_28;
  int local_20;
  int local_1c;
  int local_18;
  undefined1 *local_10;
  
  local_18 = *(int *)(in_RDI + 0x2c);
  local_1c = *(int *)(in_RDI + 0x30);
  local_20 = in_EDX + local_18 * -3;
  if (local_20 == 0) {
    local_18 = local_18 * local_1c;
    local_1c = 1;
  }
  this_00 = &local_70;
  local_10 = in_RSI;
  Mat::channel(in_stack_fffffffffffffea8,(int)((ulong)this_00 >> 0x20));
  this = (Mat *)Mat::operator_cast_to_float_(this_00);
  _c = (int)((ulong)this_00 >> 0x20);
  Mat::~Mat((Mat *)0x17ca4f);
  local_28 = this;
  Mat::channel(this,_c);
  pfVar1 = Mat::operator_cast_to_float_(&local_d0);
  Mat::~Mat((Mat *)0x17ca99);
  local_88 = pfVar1;
  Mat::channel(this,_c);
  pfVar1 = Mat::operator_cast_to_float_(&local_120);
  Mat::~Mat((Mat *)0x17cadd);
  local_d8 = pfVar1;
  for (local_124 = 0; local_124 < local_1c; local_124 = local_124 + 1) {
    for (local_128 = local_18; 0 < local_128; local_128 = local_128 + -1) {
      local_134[2] = (int)*(float *)&local_28->data;
      local_134[1] = 0;
      piVar2 = std::max<int>(local_134 + 2,local_134 + 1);
      local_134[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_134);
      local_10[2] = (char)*piVar2;
      local_140[2] = (int)*local_88;
      local_140[1] = 0;
      piVar2 = std::max<int>(local_140 + 2,local_140 + 1);
      local_140[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_140);
      local_10[1] = (char)*piVar2;
      local_14c[2] = (int)*local_d8;
      local_14c[1] = 0;
      piVar2 = std::max<int>(local_14c + 2,local_14c + 1);
      local_14c[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_14c);
      *local_10 = (char)*piVar2;
      local_10 = local_10 + 3;
      local_28 = (Mat *)((long)&local_28->data + 4);
      local_88 = local_88 + 1;
      local_d8 = local_d8 + 1;
    }
    local_10 = local_10 + local_20;
  }
  return;
}

Assistant:

static void to_bgr2rgb(const Mat& m, unsigned char* rgb, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 3;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);

    for (int y = 0; y < h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
        for (; nn > 0; nn--)
        {
            float32x4_t _rlow = vld1q_f32(ptr2);
            float32x4_t _rhigh = vld1q_f32(ptr2 + 4);
            float32x4_t _glow = vld1q_f32(ptr1);
            float32x4_t _ghigh = vld1q_f32(ptr1 + 4);
            float32x4_t _blow = vld1q_f32(ptr0);
            float32x4_t _bhigh = vld1q_f32(ptr0 + 4);

            int16x8_t _r16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_rlow)), vmovn_s32(vcvtq_s32_f32(_rhigh)));
            int16x8_t _g16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_glow)), vmovn_s32(vcvtq_s32_f32(_ghigh)));
            int16x8_t _b16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_blow)), vmovn_s32(vcvtq_s32_f32(_bhigh)));

            uint8x8x3_t _rgb;
            _rgb.val[0] = vqmovun_s16(_r16);
            _rgb.val[1] = vqmovun_s16(_g16);
            _rgb.val[2] = vqmovun_s16(_b16);

            vst3_u8(rgb, _rgb);

            rgb += 3 * 8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
        }
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            rgb[2] = SATURATE_CAST_UCHAR(*ptr0);
            rgb[1] = SATURATE_CAST_UCHAR(*ptr1);
            rgb[0] = SATURATE_CAST_UCHAR(*ptr2);

            rgb += 3;
            ptr0++;
            ptr1++;
            ptr2++;
        }

#undef SATURATE_CAST_UCHAR
        rgb += wgap;
    }
}